

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall
kj::Array<capnp::JsonCodec::AnnotatedHandler::FieldInfo>::~Array
          (Array<capnp::JsonCodec::AnnotatedHandler::FieldInfo> *this)

{
  FieldInfo *pFVar1;
  size_t sVar2;
  
  pFVar1 = this->ptr;
  if (pFVar1 != (FieldInfo *)0x0) {
    sVar2 = this->size_;
    this->ptr = (FieldInfo *)0x0;
    this->size_ = 0;
    (**this->disposer->_vptr_ArrayDisposer)(this->disposer,pFVar1,0x38,sVar2,sVar2,0);
  }
  return;
}

Assistant:

inline ~Array() noexcept { dispose(); }